

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

GCproto * fs_finish(LexState *ls,BCLine line)

{
  uint8_t *puVar1;
  SBuf *sb;
  uint uVar2;
  uint32_t uVar3;
  BCPos BVar4;
  FuncState *fs;
  lua_State *L;
  VarInfo *pVVar5;
  BCInsLine *pBVar6;
  GCtab *pGVar7;
  TValue *pTVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  BCPos BVar12;
  char *pcVar13;
  GCobj *o;
  ptrdiff_t argbase;
  byte bVar14;
  long lVar15;
  long lVar16;
  byte bVar17;
  ulong uVar18;
  VarInfo *pVVar19;
  uint sz;
  GCSize size;
  int iVar20;
  uint uVar21;
  ushort uVar22;
  MSize MVar23;
  void *__dest;
  uint uVar24;
  ulong __n;
  long lVar25;
  uint *puVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  char *pcVar30;
  GCobj *v;
  
  fs = ls->fs;
  uVar21 = line - fs->linedefined;
  L = ls->L;
  uVar2 = fs->pc;
  if (((uVar2 <= fs->lasttarget) || (uVar9 = (byte)fs->bcbase[uVar2 - 1].ins - 0x43, 9 < uVar9)) ||
     ((0x3c3U >> (uVar9 & 0x1f) & 1) == 0)) {
    if ((fs->bl->flags & 8) != 0) {
      bcemit_INS(fs,0x80000032);
    }
    bcemit_INS(fs,0x1004b);
  }
  puVar1 = &fs->bl->flags;
  *puVar1 = *puVar1 | 0x10;
  fscope_end(fs);
  if ((fs->flags & 0x40) != 0) {
    iVar20 = 0x7ffe;
    for (uVar29 = 1; uVar29 < uVar2; uVar29 = uVar29 + 1) {
      uVar9 = fs->bcbase[uVar29].ins;
      uVar11 = (uVar9 & 0xff) - 0x33;
      if (uVar11 < 0x1a) {
        if ((0x3c30000U >> (uVar11 & 0x1f) & 1) == 0) {
          if (uVar11 == 0) break;
        }
        else {
          BVar12 = bcemit_INS(fs,uVar9);
          pBVar6 = fs->bcbase;
          pBVar6[BVar12].line = pBVar6[uVar29].line;
          if (0xffff < BVar12 + iVar20) {
            err_syntax(fs->ls,LJ_ERR_XFIXUP);
          }
          pBVar6[uVar29].ins = (BVar12 + iVar20) * 0x10000 | 0x32;
        }
      }
      iVar20 = iVar20 + -1;
    }
  }
  uVar2 = fs->pc;
  uVar9 = fs->nkn;
  uVar11 = fs->nkgc;
  bVar17 = fs->nuv;
  uVar29 = (ulong)((uint)bVar17 * 2 + 2 & 0xfffffffc);
  bVar14 = 2 - (uVar21 < 0x10000);
  uVar27 = 0;
  if ((int)uVar21 < 0x100) {
    bVar14 = 0;
  }
  pVVar5 = ls->vstack;
  sb = &ls->sb;
  uVar24 = (ls->sb).b.ptr32;
  (ls->sb).p.ptr32 = uVar24;
  for (; pcVar13 = (char *)(ulong)uVar24, bVar17 != uVar27; uVar27 = uVar27 + 1) {
    uVar18 = (ulong)pVVar5[fs->uvmap[uVar27]].name.gcptr32;
    sz = *(int *)(uVar18 + 0xc) + 1;
    if ((ls->sb).e.ptr32 - uVar24 < sz) {
      pcVar13 = lj_buf_more2(sb,sz);
    }
    memcpy(pcVar13,(void *)(uVar18 + 0x10),(ulong)sz);
    uVar24 = (int)pcVar13 + sz;
    (sb->p).ptr32 = uVar24;
  }
  uVar27 = ((ulong)uVar11 + (ulong)uVar2) * 4 + 0x47 & 0xfffffffffffffff8;
  lVar15 = (ulong)uVar9 * 8 + uVar27;
  uVar3 = (ls->sb).b.ptr32;
  uVar9 = ls->vtop;
  pVVar19 = pVVar5 + fs->vbase;
  BVar12 = 0;
  while( true ) {
    uVar10 = (uint32_t)pcVar13;
    pcVar30 = (char *)((ulong)pcVar13 & 0xffffffff);
    if (pVVar5 + uVar9 <= pVVar19) break;
    if ((pVVar19->info & 6) == 0) {
      uVar11 = (pVVar19->name).gcptr32;
      uVar18 = (ulong)uVar11;
      if (uVar18 < 7) {
        if ((ls->sb).e.ptr32 - uVar10 < 0xb) {
          pcVar30 = lj_buf_more2(sb,0xb);
        }
        *pcVar30 = (char)uVar11;
        pcVar30 = pcVar30 + 1;
      }
      else {
        iVar20 = *(int *)(uVar18 + 0xc);
        MVar23 = iVar20 + 0xb;
        if ((ls->sb).e.ptr32 - uVar10 < MVar23) {
          pcVar30 = lj_buf_more2(sb,MVar23);
        }
        __n = (ulong)(iVar20 + 1);
        memcpy(pcVar30,(void *)(uVar18 + 0x10),__n);
        pcVar30 = pcVar30 + __n;
      }
      BVar4 = pVVar19->startpc;
      pcVar13 = lj_strfmt_wuleb128(pcVar30,BVar4 - BVar12);
      pcVar13 = lj_strfmt_wuleb128(pcVar13,pVVar19->endpc - BVar4);
      (sb->p).ptr32 = (uint32_t)pcVar13;
      BVar12 = BVar4;
    }
    pVVar19 = pVVar19 + 1;
  }
  lVar28 = (ulong)(uVar2 - 1 << (bVar14 & 0x1f)) + uVar29 + lVar15;
  if ((ls->sb).e.ptr32 == uVar10) {
    pcVar30 = lj_buf_more2(sb,1);
  }
  uVar10 = (int)pcVar30 + 1;
  *pcVar30 = '\0';
  (ls->sb).p.ptr32 = uVar10;
  size = (int)lVar28 + (uVar10 - (ls->sb).b.ptr32);
  o = (GCobj *)lj_mem_newgco(L,size);
  (o->gch).gct = '\a';
  (o->pt).sizept = size;
  (o->pt).trace = 0;
  bVar17 = fs->flags;
  (o->pt).flags = bVar17 & 0x9f;
  (o->gch).unused1 = fs->numparams;
  bVar14 = fs->framesize;
  (o->gch).unused2 = bVar14;
  (o->th).openupval.gcptr32 = *(uint32_t *)&ls->chunkname;
  lVar25 = uVar27 + (long)o;
  *(undefined4 *)(lVar25 + (ulong)(fs->nkgc + 1) * -4) = 0;
  uVar2 = fs->pc;
  pBVar6 = fs->bcbase;
  (o->str).hash = uVar2;
  bVar17 = (bVar17 & 2) >> 1;
  o[1].gch.nextgc.gcptr32 = (uint)bVar14 * 0x100 + (uint)bVar17 + (uint)bVar17 * 2 + 0x59;
  for (lVar16 = 0x11; lVar16 - 0x10U < (ulong)uVar2; lVar16 = lVar16 + 1) {
    *(BCIns *)((long)o + lVar16 * 4) = pBVar6[lVar16 + -0x10].ins;
  }
  uVar2 = fs->nkn;
  if ((uVar2 < 0x10001) && (uVar9 = fs->nkgc, uVar9 < 0x10001)) {
    (o->gch).metatable.gcptr32 = (uint32_t)lVar25;
    (o->pt).sizekn = uVar2;
    (o->pt).sizekgc = uVar9;
    pGVar7 = fs->kt;
    uVar27 = (ulong)(pGVar7->array).ptr32;
    for (uVar18 = 0; uVar18 < pGVar7->asize; uVar18 = uVar18 + 1) {
      if (*(int *)(uVar27 + 4 + uVar18 * 8) == 0) {
        *(double *)(lVar25 + (ulong)*(uint *)(uVar27 + uVar18 * 8) * 8) =
             (double)(uVar18 & 0xffffffff);
      }
    }
    uVar27 = (ulong)(pGVar7->node).ptr32;
    uVar2 = pGVar7->hmask;
    for (uVar9 = 0; uVar9 <= uVar2; uVar9 = uVar9 + 1) {
      if (*(int *)(uVar27 + 4 + (ulong)uVar9 * 0x18) == 0) {
        puVar26 = (uint *)((ulong)uVar9 * 0x18 + uVar27);
        if (puVar26[3] < 0xfffeffff) {
          *(undefined8 *)(lVar25 + (ulong)*puVar26 * 8) = *(undefined8 *)(puVar26 + 2);
        }
        else {
          v = (GCobj *)(ulong)puVar26[2];
          *(uint *)(lVar25 + ~(ulong)*puVar26 * 4) = puVar26[2];
          if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
            lj_gc_barrierf((global_State *)(ulong)(fs->L->glref).ptr32,o,v);
          }
          if (puVar26[3] == 0xfffffff8) {
            pVVar5 = fs->ls->vstack;
            uVar11 = (v->uv).dhash;
            bVar17 = (v->pt).sizeuv;
            for (uVar18 = 0; bVar17 != uVar18; uVar18 = uVar18 + 1) {
              uVar22 = *(ushort *)((ulong)uVar11 + uVar18 * 2);
              if (uVar22 < 0xffc4) {
                bVar14 = pVVar5[uVar22].slot;
                if ((pVVar5[uVar22].info & 1) == 0) {
                  uVar22 = bVar14 | 0xc000;
                }
                else {
                  uVar22 = bVar14 | 0x8000;
                }
              }
              else {
                uVar22 = uVar22 + 0x3c;
              }
              *(ushort *)((ulong)uVar11 + uVar18 * 2) = uVar22;
            }
          }
        }
      }
    }
    (o->uv).dhash = (uint32_t)(void *)((long)o + lVar15);
    bVar17 = fs->nuv;
    (o->pt).sizeuv = bVar17;
    memcpy((void *)((long)o + lVar15),fs->uvtmp,(ulong)((uint)bVar17 * 2));
    iVar20 = fs->linedefined;
    uVar27 = (ulong)(fs->pc - 1);
    pBVar6 = fs->bcbase;
    (o->pt).firstline = iVar20;
    (o->pt).numline = uVar21;
    (o->pt).lineinfo.ptr32 = (int)(uVar29 + lVar15) + (uint32_t)o;
    if ((int)uVar21 < 0x100) {
      uVar18 = 0;
      do {
        *(char *)((long)o + uVar18 + lVar15 + uVar29) = (char)pBVar6[uVar18 + 1].line - (char)iVar20
        ;
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar27);
    }
    else if (uVar21 < 0x10000) {
      uVar18 = 0;
      do {
        *(short *)((long)o + uVar18 * 2 + lVar15 + uVar29) =
             (short)pBVar6[uVar18 + 1].line - (short)iVar20;
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar27);
    }
    else {
      uVar18 = 0;
      do {
        *(BCLine *)((long)o + uVar18 * 4 + lVar15 + uVar29) = pBVar6[uVar18 + 1].line - iVar20;
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar27);
    }
    __dest = (void *)((long)o + lVar28);
    MVar23 = (MSize)__dest;
    (o->th).stacksize = MVar23;
    (o->pt).varinfo.ptr32 = (uVar24 - uVar3) + MVar23;
    uVar2 = (ls->sb).b.ptr32;
    memcpy(__dest,(void *)(ulong)uVar2,(ulong)((ls->sb).p.ptr32 - uVar2));
    if (((*(byte *)((ulong)(L->glref).ptr32 + 0x10b) & 1) != 0) &&
       (argbase = lj_vmevent_prepare(L,LJ_VMEVENT_BC), argbase != 0)) {
      pTVar8 = L->top;
      L->top = pTVar8 + 1;
      (pTVar8->u32).lo = (uint32_t)o;
      (pTVar8->field_2).it = 0xfffffff8;
      lj_vmevent_call(L,argbase);
    }
    lj_memprof_add_proto(&o->pt);
    lj_sysprof_add_proto(&o->pt);
    L->top = L->top + -1;
    ls->vtop = fs->vbase;
    ls->fs = fs->prev;
    return (GCproto *)o;
  }
  err_limit(fs,0x10000,"constants");
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif
#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}